

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closure.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  VMStd vm;
  allocator local_89;
  string local_88;
  VM local_68;
  
  squall::VMStd::VMStd((VMStd *)&local_68,0x400);
  squall::VMStd::dofile((VMStd *)&local_68,"closure.nut");
  std::__cxx11::string::string((string *)&local_88,"foo",&local_89);
  squall::TableBase::
  defun<void(*)(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>
            ((TableBase *)
             local_68.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_88,foo);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"bar",&local_89);
  iVar1 = squall::TableBase::call<int>
                    ((TableBase *)
                     local_68.root_table_._M_t.
                     super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>
                     .super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  poVar2 = std::operator<<((ostream *)&std::cout,"**** return value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  squall::VM::~VM(&local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("closure.nut");

        vm.defun("foo", &foo);
        int n = vm.call<int>("bar");
        std::cout << "**** return value: " << n << std::endl;
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}